

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O2

void __thiscall
duckdb::RowGroupCollection::Checkpoint
          (RowGroupCollection *this,TableDataWriter *writer,TableStatistics *global_stats)

{
  shared_ptr<duckdb::RowGroupSegmentTree,_true> *this_00;
  __int_type _Var1;
  bool bVar2;
  RowGroupSegmentTree *pRVar3;
  DatabaseInstance *db;
  DBConfig *pDVar4;
  reference pvVar5;
  pointer pRVar6;
  pointer pTVar7;
  type this_01;
  reference pvVar8;
  reference pvVar9;
  type writer_00;
  InternalException *this_02;
  ulong uVar10;
  __int_type _Var11;
  RowGroupCollection *pRVar12;
  ulong __n;
  unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *this_03;
  allocator local_289;
  _Head_base<0UL,_duckdb::RowGroupWriter_*,_false> local_288;
  RowGroupWriter *local_280;
  _Head_base<0UL,_duckdb::Task_*,_false> local_278;
  RowGroupCollection *local_270;
  TableDataWriter *local_268;
  vector<duckdb::SegmentNode<duckdb::RowGroup>,_true> segments;
  _Head_base<0UL,_duckdb::RowGroup_*,_false> local_238;
  SegmentLock l;
  RowGroupWriteData local_218;
  VacuumState vacuum_state;
  RowGroupPointer pointer;
  CollectionCheckpointState checkpoint_state;
  
  this_00 = &this->row_groups;
  local_270 = this;
  local_268 = writer;
  pRVar3 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(this_00);
  ::std::unique_lock<std::mutex>::unique_lock
            (&l.lock,&(pRVar3->super_SegmentTree<duckdb::RowGroup,_true>).node_lock);
  pRVar3 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(this_00);
  SegmentTree<duckdb::RowGroup,_true>::MoveSegments
            (&segments,&pRVar3->super_SegmentTree<duckdb::RowGroup,_true>,&l);
  pRVar12 = local_270;
  CollectionCheckpointState::CollectionCheckpointState
            (&checkpoint_state,local_270,local_268,&segments,global_stats);
  vacuum_state.can_vacuum_deletes = false;
  vacuum_state.row_start = 0;
  vacuum_state.next_vacuum_idx = 0;
  vacuum_state.row_group_counts.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  vacuum_state.row_group_counts.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vacuum_state.row_group_counts.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  InitializeVacuumState(pRVar12,&checkpoint_state,&vacuum_state,&segments);
  db = TableDataWriter::GetDatabase(local_268);
  pDVar4 = DBConfig::GetConfig(db);
  uVar10 = 0;
  for (__n = 0; __n < (ulong)((long)segments.
                                    super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                                    .
                                    super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)segments.
                                    super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                                    .
                                    super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4); __n = __n + 1)
  {
    pvVar5 = vector<duckdb::SegmentNode<duckdb::RowGroup>,_true>::get<true>(&segments,__n);
    bVar2 = ScheduleVacuumTasks(local_270,&checkpoint_state,&vacuum_state,__n,
                                uVar10 < (pDVar4->options).max_vacuum_tasks);
    if (bVar2) {
      uVar10 = uVar10 + 1;
    }
    else if ((pvVar5->node).
             super_unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t.
             super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t.
             super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>.
             super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl != (RowGroup *)0x0) {
      pRVar6 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator->
                         (&pvVar5->node);
      pRVar12 = local_270;
      RowGroup::MoveToCollection(pRVar6,local_270,vacuum_state.row_start);
      GetCheckpointTask((RowGroupCollection *)&pointer,(CollectionCheckpointState *)pRVar12,
                        (idx_t)&checkpoint_state);
      pTVar7 = unique_ptr<duckdb::TaskExecutor,_std::default_delete<duckdb::TaskExecutor>,_true>::
               operator->(&checkpoint_state.executor);
      local_278._M_head_impl = (Task *)pointer.row_start;
      pointer.row_start = 0;
      TaskExecutor::ScheduleTask
                (pTVar7,(unique_ptr<duckdb::Task,_std::default_delete<duckdb::Task>,_true> *)
                        &local_278);
      if (local_278._M_head_impl != (Task *)0x0) {
        (*(local_278._M_head_impl)->_vptr_Task[1])();
      }
      local_278._M_head_impl = (Task *)0x0;
      pRVar6 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator->
                         (&pvVar5->node);
      vacuum_state.row_start =
           vacuum_state.row_start +
           (pRVar6->super_SegmentBase<duckdb::RowGroup>).count.super___atomic_base<unsigned_long>.
           _M_i;
      if (pointer.row_start != 0) {
        (**(code **)(*(long *)pointer.row_start + 8))();
      }
    }
  }
  pTVar7 = unique_ptr<duckdb::TaskExecutor,_std::default_delete<duckdb::TaskExecutor>,_true>::
           operator->(&checkpoint_state.executor);
  TaskExecutor::WorkOnTasks(pTVar7);
  _Var11 = 0;
  uVar10 = 0;
  do {
    if ((ulong)((long)segments.
                      super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                      .
                      super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)segments.
                      super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                      .
                      super__Vector_base<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar10) {
      LOCK();
      (local_270->total_rows).super___atomic_base<unsigned_long>._M_i = _Var11;
      UNLOCK();
      ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &vacuum_state.row_group_counts);
      CollectionCheckpointState::~CollectionCheckpointState(&checkpoint_state);
      ::std::
      vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
      ::~vector(&segments.
                 super_vector<duckdb::SegmentNode<duckdb::RowGroup>,_std::allocator<duckdb::SegmentNode<duckdb::RowGroup>_>_>
               );
      ::std::unique_lock<std::mutex>::~unique_lock(&l.lock);
      return;
    }
    pvVar5 = vector<duckdb::SegmentNode<duckdb::RowGroup>,_true>::get<true>(&segments,uVar10);
    if ((pvVar5->node).super_unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>.
        _M_t.super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>.
        super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl != (RowGroup *)0x0) {
      this_03 = &pvVar5->node;
      this_01 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator*
                          (this_03);
      pvVar8 = vector<duckdb::unique_ptr<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>,_true>,_true>
               ::get<true>(&checkpoint_state.writers,uVar10);
      local_288._M_head_impl =
           (pvVar8->
           super_unique_ptr<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>_>).
           _M_t.
           super___uniq_ptr_impl<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::RowGroupWriter_*,_std::default_delete<duckdb::RowGroupWriter>_>
           .super__Head_base<0UL,_duckdb::RowGroupWriter_*,_false>._M_head_impl;
      (pvVar8->
      super_unique_ptr<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>_>)._M_t.
      super___uniq_ptr_impl<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::RowGroupWriter_*,_std::default_delete<duckdb::RowGroupWriter>_>
      .super__Head_base<0UL,_duckdb::RowGroupWriter_*,_false>._M_head_impl = (RowGroupWriter *)0x0;
      if (local_288._M_head_impl == (RowGroupWriter *)0x0) {
        this_02 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&pointer,"Missing row group writer for index %llu",&local_289);
        InternalException::InternalException<unsigned_long>(this_02,(string *)&pointer,uVar10);
        __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pvVar9 = vector<duckdb::RowGroupWriteData,_true>::get<true>
                         (&checkpoint_state.write_data,uVar10);
      local_218.states.
      super_vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pvVar9->states).
           super_vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_218.states.
      super_vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pvVar9->states).
           super_vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_218.states.
      super_vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pvVar9->states).
           super_vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (pvVar9->states).
      super_vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pvVar9->states).
      super_vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pvVar9->states).
      super_vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_218.statistics.
      super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>.
      super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pvVar9->statistics).
           super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>.
           super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>.
           _M_impl.super__Vector_impl_data._M_start;
      local_218.statistics.
      super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>.
      super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pvVar9->statistics).
           super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>.
           super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_218.statistics.
      super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>.
      super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pvVar9->statistics).
           super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>.
           super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      (pvVar9->statistics).
      super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>.
      super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pvVar9->statistics).
      super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>.
      super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pvVar9->statistics).
      super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>.
      super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      writer_00 = unique_ptr<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>,_true>
                  ::operator*((unique_ptr<duckdb::RowGroupWriter,_std::default_delete<duckdb::RowGroupWriter>,_true>
                               *)&local_288);
      RowGroup::Checkpoint(&pointer,this_01,&local_218,writer_00,global_stats);
      RowGroupWriteData::~RowGroupWriteData(&local_218);
      local_280 = local_288._M_head_impl;
      local_288._M_head_impl = (RowGroupWriter *)0x0;
      (*local_268->_vptr_TableDataWriter[4])(local_268,&pointer,&local_280);
      if (local_280 != (RowGroupWriter *)0x0) {
        (*local_280->_vptr_RowGroupWriter[1])();
      }
      local_280 = (RowGroupWriter *)0x0;
      pRVar3 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(this_00);
      local_238._M_head_impl =
           (this_03->super_unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>).
           _M_t.super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t
           .super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>.
           super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl;
      (this_03->super_unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>)._M_t.
      super___uniq_ptr_impl<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::RowGroup_*,_std::default_delete<duckdb::RowGroup>_>.
      super__Head_base<0UL,_duckdb::RowGroup_*,_false>._M_head_impl = (RowGroup *)0x0;
      SegmentTree<duckdb::RowGroup,_true>::AppendSegment
                (&pRVar3->super_SegmentTree<duckdb::RowGroup,_true>,&l,
                 (unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *)
                 &local_238);
      ::std::unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_>::~unique_ptr
                ((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>_> *)&local_238)
      ;
      _Var1 = (this_01->super_SegmentBase<duckdb::RowGroup>).count.
              super___atomic_base<unsigned_long>._M_i;
      RowGroupPointer::~RowGroupPointer(&pointer);
      if (local_288._M_head_impl != (RowGroupWriter *)0x0) {
        (*(local_288._M_head_impl)->_vptr_RowGroupWriter[1])();
      }
      _Var11 = _Var11 + _Var1;
    }
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

void RowGroupCollection::Checkpoint(TableDataWriter &writer, TableStatistics &global_stats) {
	auto l = row_groups->Lock();
	auto segments = row_groups->MoveSegments(l);

	CollectionCheckpointState checkpoint_state(*this, writer, segments, global_stats);

	VacuumState vacuum_state;
	InitializeVacuumState(checkpoint_state, vacuum_state, segments);

	try {
		// schedule tasks
		idx_t total_vacuum_tasks = 0;
		auto &config = DBConfig::GetConfig(writer.GetDatabase());

		for (idx_t segment_idx = 0; segment_idx < segments.size(); segment_idx++) {
			auto &entry = segments[segment_idx];
			auto vacuum_tasks = ScheduleVacuumTasks(checkpoint_state, vacuum_state, segment_idx,
			                                        total_vacuum_tasks < config.options.max_vacuum_tasks);
			if (vacuum_tasks) {
				// vacuum tasks were scheduled - don't schedule a checkpoint task yet
				total_vacuum_tasks++;
				continue;
			}
			if (!entry.node) {
				// row group was vacuumed/dropped - skip
				continue;
			}
			// schedule a checkpoint task for this row group
			entry.node->MoveToCollection(*this, vacuum_state.row_start);
			auto checkpoint_task = GetCheckpointTask(checkpoint_state, segment_idx);
			checkpoint_state.executor->ScheduleTask(std::move(checkpoint_task));
			vacuum_state.row_start += entry.node->count;
		}
	} catch (const std::exception &e) {
		ErrorData error(e);
		checkpoint_state.executor->PushError(std::move(error));
		checkpoint_state.executor->WorkOnTasks(); // ensure all tasks have completed first before rethrowing
		throw;
	}
	// all tasks have been successfully scheduled - execute tasks until we are done
	checkpoint_state.executor->WorkOnTasks();

	// no errors - finalize the row groups
	idx_t new_total_rows = 0;
	for (idx_t segment_idx = 0; segment_idx < segments.size(); segment_idx++) {
		auto &entry = segments[segment_idx];
		if (!entry.node) {
			// row group was vacuumed/dropped - skip
			continue;
		}
		auto &row_group = *entry.node;
		auto row_group_writer = std::move(checkpoint_state.writers[segment_idx]);
		if (!row_group_writer) {
			throw InternalException("Missing row group writer for index %llu", segment_idx);
		}
		auto pointer =
		    row_group.Checkpoint(std::move(checkpoint_state.write_data[segment_idx]), *row_group_writer, global_stats);
		writer.AddRowGroup(std::move(pointer), std::move(row_group_writer));
		row_groups->AppendSegment(l, std::move(entry.node));
		new_total_rows += row_group.count;
	}
	total_rows = new_total_rows;
}